

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O1

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Open
          (IOTHUB_MESSAGING_HANDLE messagingHandle,
          IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback,void *userContextCallback)

{
  SASL_PLAIN_CONFIG *sasl_mechanism_create_parameters;
  bool bVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  STRING_HANDLE scope;
  STRING_HANDLE key;
  STRING_HANDLE keyName;
  time_t tVar7;
  STRING_HANDLE handle;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE pSVar8;
  IO_INTERFACE_DESCRIPTION *pIVar9;
  XIO_HANDLE pXVar10;
  CONNECTION_HANDLE pCVar11;
  SESSION_HANDLE session;
  AMQP_VALUE source;
  AMQP_VALUE target;
  LINK_HANDLE pLVar12;
  MESSAGE_SENDER_HANDLE message_sender;
  AMQP_VALUE source_00;
  AMQP_VALUE target_00;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  char *pcVar13;
  IOTHUB_MESSAGING_RESULT IVar14;
  SASLCLIENTIO_CONFIG sasl_io_config;
  char *local_80;
  XIO_HANDLE local_68;
  SASL_MECHANISM_HANDLE local_60;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x45f,1,"Input parameter cannot be NULL");
    }
    target_00 = (AMQP_VALUE)0x0;
    IVar14 = IOTHUB_MESSAGING_INVALID_ARG;
    source_00 = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    local_80 = (char *)0x0;
    __s = (char *)0x0;
    goto LAB_001344e5;
  }
  if (messagingHandle->isOpened != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x464,1,"Messaging is already opened");
    }
    target_00 = (AMQP_VALUE)0x0;
    source_00 = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    local_80 = (char *)0x0;
    __s = (char *)0x0;
    IVar14 = IOTHUB_MESSAGING_OK;
    goto LAB_001344e5;
  }
  messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
  messagingHandle->sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)0x0;
  messagingHandle->connection = (CONNECTION_HANDLE)0x0;
  messagingHandle->session = (SESSION_HANDLE)0x0;
  messagingHandle->sender_link = (LINK_HANDLE)0x0;
  (messagingHandle->sasl_plain_config).authzid = (char *)0x0;
  messagingHandle->tls_io = (XIO_HANDLE)0x0;
  messagingHandle->sasl_io = (XIO_HANDLE)0x0;
  if (messagingHandle->hostname == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013397c;
    pcVar6 = "createSendTargetAddress failed - hostname cannot be NULL";
    iVar2 = 0x263;
LAB_0013396f:
    __s = (char *)0x0;
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
              ,"createSendTargetAddress",iVar2,1,pcVar6);
  }
  else {
    sVar4 = strlen(messagingHandle->hostname);
    __s = (char *)malloc(sVar4 + 0x20);
    if (__s == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar6 = "Malloc failed for sendTargetAddress";
        iVar2 = 0x26d;
        goto LAB_0013396f;
      }
    }
    else {
      iVar2 = snprintf(__s,sVar4 + 0x20,"amqps://%s/messages/deviceBound");
      if (-1 < iVar2) goto LAB_0013397e;
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createSendTargetAddress",0x272,1,"sprintf_s failed for sendTargetAddress.");
      }
      free(__s);
    }
LAB_0013397c:
    __s = (char *)0x0;
  }
LAB_0013397e:
  sasl_mechanism_create_parameters = &messagingHandle->sasl_plain_config;
  if (__s == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar6 = "Could not create sendTargetAddress";
      iVar2 = 0x474;
LAB_00133b72:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",iVar2,1,pcVar6);
    }
LAB_00133b82:
    target_00 = (AMQP_VALUE)0x0;
    IVar14 = IOTHUB_MESSAGING_ERROR;
    source_00 = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    local_80 = (char *)0x0;
  }
  else {
    if (messagingHandle->hostname == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133ac4;
      pcVar6 = "createReceiveTargetAddress failed - hostname cannot be NULL";
      iVar2 = 0x241;
LAB_00133ab7:
      local_80 = (char *)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createReceiveTargetAddress",iVar2,1,pcVar6);
    }
    else {
      sVar4 = strlen(messagingHandle->hostname);
      local_80 = (char *)malloc(sVar4 + 0x2a);
      if (local_80 == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar6 = "Malloc failed for receiveTargetAddress";
          iVar2 = 0x24b;
          goto LAB_00133ab7;
        }
      }
      else {
        iVar2 = snprintf(local_80,sVar4 + 0x2a,"amqps://%s/messages/servicebound/feedback");
        if (-1 < iVar2) goto LAB_00133ac6;
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createReceiveTargetAddress",0x250,1,
                    "sprintf_s failed for receiveTargetAddress.");
        }
        free(local_80);
      }
LAB_00133ac4:
      local_80 = (char *)0x0;
    }
LAB_00133ac6:
    if (local_80 == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar6 = "Could not create receiveTargetAddress";
        iVar2 = 0x479;
        goto LAB_00133b72;
      }
      goto LAB_00133b82;
    }
    pcVar6 = messagingHandle->iothubName;
    if (pcVar6 == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)0x0;
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createAuthCid",0x21d,1,"createSasPlainConfig failed - iothubName cannot be NULL"
                 );
      }
    }
    else {
      sVar4 = strlen(messagingHandle->keyName);
      sVar5 = strlen(pcVar6);
      sVar4 = sVar4 + sVar5 + 0xc;
      pcVar6 = (char *)malloc(sVar4);
      if (pcVar6 == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133c53;
        pcVar6 = (char *)0x0;
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createAuthCid",0x229,1,"Malloc failed for authCid.");
      }
      else {
        iVar2 = snprintf(pcVar6,sVar4,"%s@sas.root.%s");
        if (iVar2 < 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"createAuthCid",0x22e,1,"sprintf_s failed for authCid.");
          }
          free(pcVar6);
LAB_00133c53:
          pcVar6 = (char *)0x0;
        }
      }
    }
    sasl_mechanism_create_parameters->authcid = pcVar6;
    if (pcVar6 == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar6 = "Could not create authCid";
        iVar2 = 0x47e;
LAB_001340a3:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"IoTHubMessaging_LL_Open",iVar2,1,pcVar6);
      }
LAB_001340b3:
      target_00 = (AMQP_VALUE)0x0;
      IVar14 = IOTHUB_MESSAGING_ERROR;
      source_00 = (AMQP_VALUE)0x0;
      target = (AMQP_VALUE)0x0;
      source = (AMQP_VALUE)0x0;
    }
    else {
      local_58 = (char *)0x0;
      if (messagingHandle->sharedAccessKey == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar6 = "createSasPlainConfig failed - sharedAccessKey cannot be NULL";
          iVar2 = 0x1d1;
          goto LAB_00133e1e;
        }
LAB_00133e2e:
        pcVar13 = (char *)0x0;
      }
      else {
        if (messagingHandle->hostname == (char *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133e2e;
          pcVar6 = "createSasPlainConfig failed - hostname cannot be NULL";
          iVar2 = 0x1d6;
        }
        else {
          if (messagingHandle->keyName != (char *)0x0) {
            scope = STRING_construct(messagingHandle->hostname);
            if (scope == (STRING_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar6 = "STRING_construct failed for hostName";
                iVar2 = 0x1e6;
LAB_00133e8f:
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"createSasToken",iVar2,1,pcVar6);
              }
LAB_00133e9f:
              key = (STRING_HANDLE)0x0;
LAB_00133ea1:
              keyName = (STRING_HANDLE)0x0;
              pcVar13 = (char *)0x0;
            }
            else {
              key = STRING_construct(messagingHandle->sharedAccessKey);
              if (key == (STRING_HANDLE)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar6 = "STRING_construct failed for sharedAccessKey";
                  iVar2 = 0x1eb;
                  goto LAB_00133e8f;
                }
                goto LAB_00133e9f;
              }
              keyName = STRING_construct(messagingHandle->keyName);
              if (keyName == (STRING_HANDLE)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"createSasToken",0x1f0,1,"STRING_construct failed for keyName");
                }
                goto LAB_00133ea1;
              }
              tVar7 = time((time_t *)0x0);
              handle = SASToken_Create(key,scope,keyName,tVar7 + 0x1e13380);
              if (handle == (STRING_HANDLE)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar6 = "SASToken_Create failed";
                  iVar2 = 0x1fc;
                  goto LAB_00133f3d;
                }
LAB_00133f4a:
                pcVar13 = (char *)0x0;
              }
              else {
                pcVar6 = STRING_c_str(handle);
                if (pcVar6 == (char *)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133f4a;
                  pcVar6 = "STRING_c_str returned NULL";
                  iVar2 = 0x201;
                }
                else {
                  iVar2 = mallocAndStrcpy_s(&local_58,pcVar6);
                  pcVar13 = local_58;
                  if (iVar2 == 0) goto LAB_00133f5b;
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133f4a;
                  pcVar6 = "mallocAndStrcpy_s failed for sharedAccessToken";
                  iVar2 = 0x206;
                }
LAB_00133f3d:
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"createSasToken",iVar2,1,pcVar6);
                pcVar13 = (char *)0x0;
              }
LAB_00133f5b:
              STRING_delete(handle);
            }
            STRING_delete(keyName);
            STRING_delete(key);
            STRING_delete(scope);
            goto LAB_00133f82;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133e2e;
          pcVar6 = "createSasPlainConfig failed - keyName cannot be NULL";
          iVar2 = 0x1db;
        }
LAB_00133e1e:
        pcVar13 = (char *)0x0;
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createSasToken",iVar2,1,pcVar6);
      }
LAB_00133f82:
      (messagingHandle->sasl_plain_config).passwd = pcVar13;
      if (pcVar13 == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar6 = "Could not create sasToken";
          iVar2 = 0x483;
          goto LAB_001340a3;
        }
        goto LAB_001340b3;
      }
      sasl_mechanism_interface_description = saslplain_get_interface();
      if (sasl_mechanism_interface_description == (SASL_MECHANISM_INTERFACE_DESCRIPTION *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar6 = "Could not get SASL plain mechanism interface.";
          iVar2 = 0x48c;
LAB_001343ad:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Open",iVar2,1,pcVar6);
        }
LAB_001343bd:
        target_00 = (AMQP_VALUE)0x0;
        IVar14 = IOTHUB_MESSAGING_ERROR;
        source_00 = (AMQP_VALUE)0x0;
        target = (AMQP_VALUE)0x0;
        source = (AMQP_VALUE)0x0;
        bVar1 = false;
      }
      else {
        pSVar8 = saslmechanism_create
                           (sasl_mechanism_interface_description,sasl_mechanism_create_parameters);
        messagingHandle->sasl_mechanism_handle = pSVar8;
        if (pSVar8 == (SASL_MECHANISM_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create SASL plain mechanism.";
            iVar2 = 0x491;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        local_58 = messagingHandle->hostname;
        local_50 = 0x1627;
        local_48 = 0;
        uStack_40 = 0;
        pIVar9 = platform_get_default_tlsio();
        if (pIVar9 == (IO_INTERFACE_DESCRIPTION *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not get default TLS IO interface.";
            iVar2 = 0x49f;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        pXVar10 = xio_create(pIVar9,&local_58);
        messagingHandle->tls_io = pXVar10;
        if (pXVar10 == (XIO_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create TLS IO.";
            iVar2 = 0x4a4;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        if ((messagingHandle->trusted_cert != (char *)0x0) &&
           (iVar2 = xio_setoption(pXVar10,"TrustedCerts",messagingHandle->trusted_cert), iVar2 != 0)
           ) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Open",0x4a9,1,"Could set tlsio trusted certificate.");
          }
          xio_destroy(messagingHandle->tls_io);
          messagingHandle->tls_io = (XIO_HANDLE)0x0;
          goto LAB_001343bd;
        }
        (messagingHandle->callback_data).openCompleteCompleteCallback = openCompleteCallback;
        (messagingHandle->callback_data).openUserContext = userContextCallback;
        local_60 = messagingHandle->sasl_mechanism_handle;
        local_68 = messagingHandle->tls_io;
        pIVar9 = saslclientio_get_interface_description();
        if (pIVar9 == (IO_INTERFACE_DESCRIPTION *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create get SASL IO interface description.";
            iVar2 = 0x4ba;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        pXVar10 = xio_create(pIVar9,&local_68);
        messagingHandle->sasl_io = pXVar10;
        if (pXVar10 == (XIO_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create SASL IO.";
            iVar2 = 0x4bf;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        pCVar11 = connection_create(pXVar10,messagingHandle->hostname,"some",(ON_NEW_ENDPOINT)0x0,
                                    (void *)0x0);
        messagingHandle->connection = pCVar11;
        if (pCVar11 == (CONNECTION_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create connection.";
            iVar2 = 0x4c4;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        session = session_create(pCVar11,(ON_LINK_ATTACHED)0x0,(void *)0x0);
        messagingHandle->session = session;
        if (session == (SESSION_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not create session.";
            iVar2 = 0x4c9;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        iVar2 = session_set_incoming_window(session,0x7fffffff);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not set incoming window.";
            iVar2 = 0x4ce;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        iVar2 = session_set_outgoing_window(messagingHandle->session,0x3fc00);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar6 = "Could not set outgoing window.";
            iVar2 = 0x4d3;
            goto LAB_001343ad;
          }
          goto LAB_001343bd;
        }
        source = messaging_create_source("ingress");
        if (source == (AMQP_VALUE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Open",0x4d8,1,"Could not create source for link.");
          }
          target_00 = (AMQP_VALUE)0x0;
          source_00 = (AMQP_VALUE)0x0;
          target = (AMQP_VALUE)0x0;
          source = (AMQP_VALUE)0x0;
          bVar1 = false;
          IVar14 = IOTHUB_MESSAGING_ERROR;
        }
        else {
          target = messaging_create_target(__s);
          if (target == (AMQP_VALUE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Open",0x4dd,1,"Could not create target for link.");
            }
            target_00 = (AMQP_VALUE)0x0;
            source_00 = (AMQP_VALUE)0x0;
            bVar1 = false;
            IVar14 = IOTHUB_MESSAGING_ERROR;
            target = (AMQP_VALUE)0x0;
          }
          else {
            pLVar12 = link_create(messagingHandle->session,"sender-link",false,source,target);
            messagingHandle->sender_link = pLVar12;
            if (pLVar12 == (LINK_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar6 = "Could not create link.";
                iVar2 = 0x4e2;
LAB_001346cc:
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Open",iVar2,1,pcVar6);
              }
            }
            else {
              iVar2 = attachServiceClientTypeToLink(pLVar12);
              if (iVar2 == 0) {
                iVar2 = link_set_snd_settle_mode(messagingHandle->sender_link,'\0');
                if (iVar2 == 0) {
                  message_sender =
                       messagesender_create
                                 (messagingHandle->sender_link,IoTHubMessaging_LL_SenderStateChanged
                                  ,messagingHandle);
                  messagingHandle->message_sender = message_sender;
                  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      pcVar6 = "Could not create message sender.";
                      iVar2 = 0x4f1;
                      goto LAB_001346cc;
                    }
                  }
                  else {
                    iVar2 = messagesender_open(message_sender);
                    if (iVar2 == 0) {
                      source_00 = messaging_create_source(local_80);
                      if (source_00 != (AMQP_VALUE)0x0) {
                        target_00 = messaging_create_target("receiver_001");
                        if (target_00 == (AMQP_VALUE)0x0) {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 == (LOGGER_LOG)0x0) {
                            target_00 = (AMQP_VALUE)0x0;
                          }
                          else {
                            pcVar6 = "Could not create target for link.";
                            target_00 = (AMQP_VALUE)0x0;
                            iVar2 = 0x500;
LAB_00134901:
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                      ,"IoTHubMessaging_LL_Open",iVar2,1,pcVar6);
                          }
                        }
                        else {
                          pLVar12 = link_create(messagingHandle->session,"receiver-link",true,
                                                source_00,target_00);
                          messagingHandle->receiver_link = pLVar12;
                          if (pLVar12 == (LINK_HANDLE)0x0) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              pcVar6 = "Could not create link.";
                              iVar2 = 0x505;
                              goto LAB_00134901;
                            }
                          }
                          else {
                            iVar2 = attachServiceClientTypeToLink(pLVar12);
                            if (iVar2 == 0) {
                              iVar2 = link_set_rcv_settle_mode(messagingHandle->receiver_link,'\0');
                              if (iVar2 == 0) {
                                message_receiver =
                                     messagereceiver_create
                                               (messagingHandle->receiver_link,
                                                IoTHubMessaging_LL_ReceiverStateChanged,
                                                messagingHandle);
                                messagingHandle->message_receiver = message_receiver;
                                if (message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) {
                                  iVar2 = messagereceiver_open
                                                    (message_receiver,
                                                     IoTHubMessaging_LL_FeedbackMessageReceived,
                                                     messagingHandle);
                                  if (iVar2 == 0) {
                                    messagingHandle->isOpened = 1;
                                    IVar14 = IOTHUB_MESSAGING_OK;
                                    bVar1 = true;
                                  }
                                  else {
                                    p_Var3 = xlogging_get_log_function();
                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                      (*p_Var3)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                ,"IoTHubMessaging_LL_Open",0x519,1,
                                                "Could not open the message receiver.");
                                    }
                                    messagereceiver_destroy(messagingHandle->message_receiver);
                                    messagingHandle->message_receiver = (MESSAGE_RECEIVER_HANDLE)0x0
                                    ;
                                    IVar14 = IOTHUB_MESSAGING_ERROR;
                                    bVar1 = false;
                                  }
                                  goto LAB_001343c7;
                                }
                                p_Var3 = xlogging_get_log_function();
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  pcVar6 = "Could not create message receiver.";
                                  iVar2 = 0x514;
                                  goto LAB_00134901;
                                }
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  pcVar6 = "Could not set the sender settle mode.";
                                  iVar2 = 0x50f;
                                  goto LAB_00134901;
                                }
                              }
                            }
                            else {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                pcVar6 = "Could not create link.";
                                iVar2 = 0x50a;
                                goto LAB_00134901;
                              }
                            }
                          }
                        }
                        bVar1 = false;
                        IVar14 = IOTHUB_MESSAGING_ERROR;
                        goto LAB_001343c7;
                      }
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        pcVar6 = "Could not create source for link.";
                        iVar2 = 0x4fb;
                        goto LAB_001346cc;
                      }
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        pcVar6 = "Could not open the message sender.";
                        iVar2 = 0x4f6;
                        goto LAB_001346cc;
                      }
                    }
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar6 = "Could not set the sender settle mode.";
                    iVar2 = 0x4ec;
                    goto LAB_001346cc;
                  }
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar6 = "Could not set the sender attach properties.";
                  iVar2 = 0x4e7;
                  goto LAB_001346cc;
                }
              }
            }
            target_00 = (AMQP_VALUE)0x0;
            source_00 = (AMQP_VALUE)0x0;
            bVar1 = false;
            IVar14 = IOTHUB_MESSAGING_ERROR;
          }
        }
      }
LAB_001343c7:
      if (!bVar1) {
        if (messagingHandle->message_sender != (MESSAGE_SENDER_HANDLE)0x0) {
          messagesender_destroy(messagingHandle->message_sender);
          messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
        }
        if (messagingHandle->tls_io != (XIO_HANDLE)0x0) {
          xio_destroy(messagingHandle->tls_io);
          messagingHandle->tls_io = (XIO_HANDLE)0x0;
        }
        if (messagingHandle->sasl_io != (XIO_HANDLE)0x0) {
          xio_destroy(messagingHandle->sasl_io);
          messagingHandle->sasl_io = (XIO_HANDLE)0x0;
        }
        if (messagingHandle->session != (SESSION_HANDLE)0x0) {
          session_destroy(messagingHandle->session);
          messagingHandle->session = (SESSION_HANDLE)0x0;
        }
        pCVar11 = messagingHandle->connection;
        if (pCVar11 != (CONNECTION_HANDLE)0x0) {
          connection_destroy(pCVar11);
          messagingHandle->connection = (CONNECTION_HANDLE)0x0;
        }
        if (messagingHandle->receiver_link != (LINK_HANDLE)0x0) {
          link_destroy(messagingHandle->receiver_link);
          messagingHandle->receiver_link = (LINK_HANDLE)0x0;
        }
      }
    }
  }
  if (IVar14 == IOTHUB_MESSAGING_OK) {
    IVar14 = IOTHUB_MESSAGING_OK;
  }
  else {
    if (sasl_mechanism_create_parameters->authcid != (char *)0x0) {
      free(sasl_mechanism_create_parameters->authcid);
      sasl_mechanism_create_parameters->authcid = (char *)0x0;
    }
    pcVar6 = (messagingHandle->sasl_plain_config).passwd;
    if (pcVar6 != (char *)0x0) {
      free(pcVar6);
      (messagingHandle->sasl_plain_config).passwd = (char *)0x0;
    }
  }
LAB_001344e5:
  amqpvalue_destroy(source);
  amqpvalue_destroy(target);
  amqpvalue_destroy(source_00);
  amqpvalue_destroy(target_00);
  if (__s != (char *)0x0) {
    free(__s);
  }
  if (local_80 != (char *)0x0) {
    free(local_80);
  }
  return IVar14;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Open(IOTHUB_MESSAGING_HANDLE messagingHandle, IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    char* send_target_address = NULL;
    char* receive_target_address = NULL;

    TLSIO_CONFIG tls_io_config;
    SASLCLIENTIO_CONFIG sasl_io_config;

    AMQP_VALUE sendSource = NULL;
    AMQP_VALUE sendTarget = NULL;

    AMQP_VALUE receiveSource = NULL;
    AMQP_VALUE receiveTarget = NULL;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened != 0)
    {
        LogError("Messaging is already opened");
        result = IOTHUB_MESSAGING_OK;
    }
    else
    {
        messagingHandle->message_sender = NULL;
        messagingHandle->connection = NULL;
        messagingHandle->session = NULL;
        messagingHandle->sender_link = NULL;
        messagingHandle->sasl_plain_config.authzid = NULL;
        messagingHandle->sasl_mechanism_handle = NULL;
        messagingHandle->tls_io = NULL;
        messagingHandle->sasl_io = NULL;

        if ((send_target_address = createSendTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create sendTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((receive_target_address = createReceiveTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create receiveTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.authcid = createAuthCid(messagingHandle)) == NULL)
        {
            LogError("Could not create authCid");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.passwd = createSasToken(messagingHandle)) == NULL)
        {
            LogError("Could not create sasToken");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            const SASL_MECHANISM_INTERFACE_DESCRIPTION* sasl_mechanism_interface;

            if ((sasl_mechanism_interface = saslplain_get_interface()) == NULL)
            {
                LogError("Could not get SASL plain mechanism interface.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else if ((messagingHandle->sasl_mechanism_handle = saslmechanism_create(sasl_mechanism_interface, &messagingHandle->sasl_plain_config)) == NULL)
            {
                LogError("Could not create SASL plain mechanism.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                tls_io_config.hostname = messagingHandle->hostname;
                tls_io_config.port = 5671;
                tls_io_config.underlying_io_interface = NULL;
                tls_io_config.underlying_io_parameters = NULL;

                const IO_INTERFACE_DESCRIPTION* tlsio_interface;

                if ((tlsio_interface = platform_get_default_tlsio()) == NULL)
                {
                    LogError("Could not get default TLS IO interface.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if ((messagingHandle->tls_io = xio_create(tlsio_interface, &tls_io_config)) == NULL)
                {
                    LogError("Could not create TLS IO.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if (messagingHandle->trusted_cert != NULL && xio_setoption(messagingHandle->tls_io, OPTION_TRUSTED_CERT, messagingHandle->trusted_cert) != 0)
                {
                    LogError("Could set tlsio trusted certificate.");
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    messagingHandle->callback_data.openCompleteCompleteCallback = openCompleteCallback;
                    messagingHandle->callback_data.openUserContext = userContextCallback;

                    sasl_io_config.sasl_mechanism = messagingHandle->sasl_mechanism_handle;
                    sasl_io_config.underlying_io = messagingHandle->tls_io;

                    const IO_INTERFACE_DESCRIPTION* saslclientio_interface;

                    if ((saslclientio_interface = saslclientio_get_interface_description()) == NULL)
                    {
                        LogError("Could not create get SASL IO interface description.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sasl_io = xio_create(saslclientio_interface, &sasl_io_config)) == NULL)
                    {
                        LogError("Could not create SASL IO.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->connection = connection_create(messagingHandle->sasl_io, messagingHandle->hostname, "some", NULL, NULL)) == NULL)
                    {
                        LogError("Could not create connection.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->session = session_create(messagingHandle->connection, NULL, NULL)) == NULL)
                    {
                        LogError("Could not create session.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_incoming_window(messagingHandle->session, 2147483647) != 0)
                    {
                        LogError("Could not set incoming window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_outgoing_window(messagingHandle->session, 255 * 1024) != 0)
                    {
                        LogError("Could not set outgoing window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendSource = messaging_create_source("ingress")) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendTarget = messaging_create_target(send_target_address)) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sender_link = link_create(messagingHandle->session, "sender-link", role_sender, sendSource, sendTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->sender_link) != 0)
                    {
                        LogError("Could not set the sender attach properties.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_snd_settle_mode(messagingHandle->sender_link, sender_settle_mode_unsettled) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_sender = messagesender_create(messagingHandle->sender_link, IoTHubMessaging_LL_SenderStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagesender_open(messagingHandle->message_sender) != 0)
                    {
                        LogError("Could not open the message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveSource = messaging_create_source(receive_target_address)) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveTarget = messaging_create_target("receiver_001")) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->receiver_link = link_create(messagingHandle->session, "receiver-link", role_receiver, receiveSource, receiveTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->receiver_link) != 0)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_rcv_settle_mode(messagingHandle->receiver_link, receiver_settle_mode_first) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_receiver = messagereceiver_create(messagingHandle->receiver_link, IoTHubMessaging_LL_ReceiverStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message receiver.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagereceiver_open(messagingHandle->message_receiver, IoTHubMessaging_LL_FeedbackMessageReceived, messagingHandle) != 0)
                    {
                        LogError("Could not open the message receiver.");
                        messagereceiver_destroy(messagingHandle->message_receiver);
                        messagingHandle->message_receiver = NULL;
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        messagingHandle->isOpened = true;
                        result = IOTHUB_MESSAGING_OK;
                    }
                }
            }
            if (result != IOTHUB_MESSAGING_OK)
            {
                if (messagingHandle->message_sender != NULL)
                {
                    messagesender_destroy(messagingHandle->message_sender);
                    messagingHandle->message_sender = NULL;
                }
                if (messagingHandle->tls_io != NULL)
                {
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                }
                if (messagingHandle->sasl_io != NULL)
                {
                    xio_destroy(messagingHandle->sasl_io);
                    messagingHandle->sasl_io = NULL;
                }
                if (messagingHandle->session != NULL)
                {
                    session_destroy(messagingHandle->session);
                    messagingHandle->session = NULL;
                }
                if (messagingHandle->connection != NULL)
                {
                    connection_destroy(messagingHandle->connection);
                    messagingHandle->connection = NULL;
                }
                if (messagingHandle->receiver_link != NULL)
                {
                    link_destroy(messagingHandle->receiver_link);
                    messagingHandle->receiver_link = NULL;
                }
            }
        }
        if (result != IOTHUB_MESSAGING_OK)
        {
            if (messagingHandle->sasl_plain_config.authcid != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.authcid);
                messagingHandle->sasl_plain_config.authcid = NULL;
            }
            if (messagingHandle->sasl_plain_config.passwd != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.passwd);
                messagingHandle->sasl_plain_config.passwd = NULL;
            }
        }
    }
    amqpvalue_destroy(sendSource);
    amqpvalue_destroy(sendTarget);
    amqpvalue_destroy(receiveSource);
    amqpvalue_destroy(receiveTarget);

    if (send_target_address != NULL)
    {
        free(send_target_address);
    }
    if (receive_target_address != NULL)
    {
        free(receive_target_address);
    }
    return result;
}